

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O3

VkImageCreateInfo *
vkt::synchronization::makeImageCreateInfo
          (VkImageCreateInfo *__return_storage_ptr__,VkImageType imageType,VkExtent3D *extent,
          VkFormat format,VkImageUsageFlags usage)

{
  deUint32 dVar1;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->imageType = imageType;
  __return_storage_ptr__->format = format;
  dVar1 = extent->height;
  (__return_storage_ptr__->extent).width = extent->width;
  (__return_storage_ptr__->extent).height = dVar1;
  (__return_storage_ptr__->extent).depth = extent->depth;
  __return_storage_ptr__->mipLevels = 1;
  __return_storage_ptr__->arrayLayers = 1;
  __return_storage_ptr__->samples = VK_SAMPLE_COUNT_1_BIT;
  __return_storage_ptr__->tiling = VK_IMAGE_TILING_OPTIMAL;
  __return_storage_ptr__->usage = usage;
  __return_storage_ptr__->sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  __return_storage_ptr__->queueFamilyIndexCount = 0;
  __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)0x0;
  __return_storage_ptr__->initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  return __return_storage_ptr__;
}

Assistant:

VkImageCreateInfo makeImageCreateInfo (const VkImageType imageType, const VkExtent3D& extent, const VkFormat format, const VkImageUsageFlags usage)
{
	const VkImageCreateInfo imageInfo =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType          sType;
		DE_NULL,									// const void*              pNext;
		(VkImageCreateFlags)0,						// VkImageCreateFlags       flags;
		imageType,									// VkImageType              imageType;
		format,										// VkFormat                 format;
		extent,										// VkExtent3D               extent;
		1u,											// uint32_t                 mipLevels;
		1u,											// uint32_t                 arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits    samples;
		VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling            tiling;
		usage,										// VkImageUsageFlags        usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode            sharingMode;
		0u,											// uint32_t                 queueFamilyIndexCount;
		DE_NULL,									// const uint32_t*          pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout            initialLayout;
	};
	return imageInfo;
}